

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O1

int parser_key(sf_parser *sfp,sf_vec *dest)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  
  pbVar1 = sfp->pos;
  if ((*pbVar1 - 0x61 < 0x1a) || (iVar2 = -1, *pbVar1 == 0x2a)) {
    pbVar3 = pbVar1 + 1;
    sfp->pos = pbVar3;
    if (pbVar3 != sfp->end) {
LAB_00117c2c:
      switch(*pbVar3) {
      case 0x2a:
      case 0x2d:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x5f:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
      case 0x78:
      case 0x79:
      case 0x7a:
        goto switchD_00117c41_caseD_2a;
      default:
        break;
      }
    }
switchD_00117c41_caseD_2b:
    iVar2 = 0;
    if (dest != (sf_vec *)0x0) {
      dest->base = pbVar1;
      dest->len = (long)pbVar3 - (long)pbVar1;
    }
  }
  return iVar2;
switchD_00117c41_caseD_2a:
  pbVar3 = pbVar3 + 1;
  sfp->pos = pbVar3;
  if (pbVar3 == sfp->end) goto switchD_00117c41_caseD_2b;
  goto LAB_00117c2c;
}

Assistant:

static int parser_key(sf_parser *sfp, sf_vec *dest) {
  const uint8_t *base;

  switch (*sfp->pos) {
  case '*':
  LCALPHA_CASES:
    break;
  default:
    return SF_ERR_PARSE_ERROR;
  }

  base = sfp->pos++;

  for (; !parser_eof(sfp); ++sfp->pos) {
    switch (*sfp->pos) {
    case '_':
    case '-':
    case '.':
    case '*':
    DIGIT_CASES:
    LCALPHA_CASES:
      continue;
    }

    break;
  }

  if (dest) {
    dest->base = (uint8_t *)base;
    dest->len = (size_t)(sfp->pos - dest->base);
  }

  return 0;
}